

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

FileDescriptor __thiscall
google::OpenObjectFileContainingPcAndGetStartAddress
          (google *this,uint64_t pc,uint64_t *start_address,uint64_t *base_address,
          char *out_file_name,size_t out_file_name_size)

{
  char *pcVar1;
  FileDescriptor fd;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  Elf64_Off EVar9;
  int __old_val;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  size_t __n;
  long lVar13;
  FileDescriptor mem_fd;
  FileDescriptor maps_fd;
  FileDescriptor local_524;
  uint64_t *local_520;
  uint64_t local_518;
  char *local_510;
  size_t local_508;
  char *local_500;
  size_t local_4f8;
  uint64_t end_address;
  LineReader local_4e8;
  uint64_t file_offset;
  long local_4a8;
  long local_4a0;
  Elf64_Ehdr ehdr;
  char buf [1024];
  
  local_518 = pc;
  do {
    maps_fd.fd_ = open("/proc/self/maps",0);
    if (maps_fd.fd_ != -1) goto LAB_0011d50f;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  maps_fd.fd_ = -1;
  *(undefined4 *)this = 0xffffffff;
  goto LAB_0011d8b1;
  while (piVar5 = __errno_location(), *piVar5 == 4) {
LAB_0011d50f:
    mem_fd.fd_ = open("/proc/self/mem",0);
    fd = maps_fd;
    if (mem_fd.fd_ != -1) {
      local_4e8.fd_ = maps_fd.fd_;
      pcVar6 = buf;
      local_4e8.buf_len_ = 0x400;
      local_4e8.offset_ = 0;
      sVar11 = 0;
      pcVar8 = pcVar6;
      local_520 = base_address;
      local_510 = out_file_name;
      local_508 = out_file_name_size;
      local_4e8.buf_ = pcVar6;
      local_4e8.eol_ = pcVar6;
      local_4e8.eod_ = pcVar6;
      goto LAB_0011d585;
    }
  }
  mem_fd.fd_ = -1;
LAB_0011d8a3:
  *(undefined4 *)this = 0xffffffff;
  goto LAB_0011d8a7;
LAB_0011d585:
  do {
    if (buf == pcVar8) {
      lVar13 = ReadFromOffset(fd.fd_,buf,0x400,sVar11);
      if (lVar13 < 1) goto LAB_0011d8a3;
      pcVar8 = buf + lVar13;
LAB_0011d62f:
      sVar11 = sVar11 + lVar13;
      pcVar10 = buf;
      local_4e8.offset_ = sVar11;
      local_4e8.bol_ = buf;
      local_4e8.eod_ = pcVar8;
    }
    else {
      pcVar10 = pcVar6 + 1;
      local_4e8.bol_ = pcVar10;
      if (pcVar8 < pcVar10) {
        abort();
      }
      pcVar6 = anon_unknown_0::LineReader::FindLineFeed(&local_4e8);
      if (pcVar6 == (char *)0x0) {
        __n = (long)pcVar8 - (long)pcVar10;
        memmove(buf,pcVar10,__n);
        lVar13 = ReadFromOffset(fd.fd_,buf + __n,0x400 - __n,sVar11);
        if (0 < lVar13) {
          pcVar8 = buf + __n + lVar13;
          goto LAB_0011d62f;
        }
        goto LAB_0011d8a3;
      }
    }
    pcVar6 = anon_unknown_0::LineReader::FindLineFeed(&local_4e8);
    local_4e8.eol_ = pcVar6;
    if (pcVar6 == (char *)0x0) goto LAB_0011d8a3;
    *pcVar6 = '\0';
    pcVar10 = GetHex(pcVar10,pcVar6,start_address);
    if ((((pcVar10 == pcVar6) || (*pcVar10 != '-')) ||
        (pcVar10 = GetHex(pcVar10 + 1,pcVar6,&end_address), pcVar10 == pcVar6)) || (*pcVar10 != ' ')
       ) goto LAB_0011d8a3;
    lVar13 = 0;
    pcVar1 = pcVar10 + 1;
    for (pcVar7 = pcVar1; (pcVar7 < pcVar6 && (*pcVar7 != ' ')); pcVar7 = pcVar7 + 1) {
      lVar13 = lVar13 + -1;
    }
    if ((1U - lVar13 < 5) || (pcVar7 == pcVar6)) goto LAB_0011d8a3;
    local_500 = pcVar1;
    local_4f8 = sVar11;
    if ((*pcVar1 == 'r') &&
       (bVar2 = ReadFromOffsetExact(mem_fd.fd_,&ehdr,0x40,*start_address),
       bVar2 && ehdr.e_ident._0_4_ == 0x464c457f)) {
      if (ehdr.e_type == 2) {
        *local_520 = 0;
      }
      else if (ehdr.e_type == 3) {
        *local_520 = *start_address;
        uVar12 = (ulong)ehdr.e_phnum;
        EVar9 = ehdr.e_phoff;
        while (bVar2 = uVar12 != 0, uVar12 = uVar12 - 1, bVar2) {
          bVar2 = ReadFromOffsetExact(mem_fd.fd_,&file_offset,0x38,*start_address + EVar9);
          if ((bVar2 && (int)file_offset == 1) && (local_4a8 == 0)) {
            *local_520 = *start_address - local_4a0;
            break;
          }
          EVar9 = EVar9 + 0x38;
        }
      }
    }
    sVar11 = local_4f8;
  } while ((((local_518 < *start_address) || (end_address <= local_518)) || (*local_500 != 'r')) ||
          (pcVar10[3] != 'x'));
  pcVar8 = GetHex(pcVar10 + (2 - lVar13),pcVar6,&file_offset);
  sVar11 = local_508;
  pcVar10 = local_510;
  if ((pcVar8 == pcVar6) || (*pcVar8 != ' ')) goto LAB_0011d8a3;
  uVar3 = 0;
  do {
    while( true ) {
      pcVar8 = pcVar8 + 1;
      if (pcVar6 <= pcVar8) goto LAB_0011d852;
      if (*pcVar8 != ' ') break;
      uVar3 = uVar3 + 1;
    }
  } while (uVar3 < 2);
LAB_0011d852:
  if (pcVar8 == pcVar6) goto LAB_0011d8a3;
  do {
    iVar4 = open(pcVar8,0);
    if (iVar4 != -1) {
      local_524.fd_ = -1;
      goto LAB_0011d8d5;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  local_524.fd_ = -1;
  strncpy(pcVar10,pcVar8,sVar11);
  pcVar10[sVar11 - 1] = '\0';
LAB_0011d8d5:
  *(int *)this = iVar4;
  glog_internal_namespace_::FileDescriptor::safe_close(&local_524);
LAB_0011d8a7:
  glog_internal_namespace_::FileDescriptor::safe_close(&mem_fd);
LAB_0011d8b1:
  glog_internal_namespace_::FileDescriptor::safe_close(&maps_fd);
  return (FileDescriptor)(int)this;
}

Assistant:

static ATTRIBUTE_NOINLINE FileDescriptor
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t& start_address,
                                             uint64_t& base_address,
                                             char* out_file_name,
                                             size_t out_file_name_size) {
  FileDescriptor maps_fd{
      FailureRetry([] { return open("/proc/self/maps", O_RDONLY); })};
  if (!maps_fd) {
    return nullptr;
  }

  FileDescriptor mem_fd{
      FailureRetry([] { return open("/proc/self/mem", O_RDONLY); })};
  if (!mem_fd) {
    return nullptr;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  LineReader reader(maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    const char* cursor;
    const char* eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return nullptr;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char* const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return nullptr;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd.get(), &ehdr, sizeof(ElfW(Ehdr)),
                            start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd.get(), &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (start_address > pc || pc >= end_address) {
      continue;  // We skip this map.  PC isn't in this map.
    }

    // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return nullptr;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    FileDescriptor object_fd{
        FailureRetry([cursor] { return open(cursor, O_RDONLY); })};
    if (!object_fd) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return nullptr;
    }
    return object_fd;
  }
}